

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O2

Intersection * __thiscall CornellBox::intersects(CornellBox *this,Ray *r)

{
  reference ppTVar1;
  Intersection *pIVar2;
  int t;
  ulong __n;
  Intersection *pIVar3;
  
  pIVar3 = (Intersection *)0x0;
  for (__n = 0; __n < (ulong)((long)(this->triangles).
                                    super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->triangles).
                                    super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    ppTVar1 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::at(&this->triangles,__n);
    pIVar2 = Triangle::intersects(*ppTVar1,r);
    if (pIVar2 != (Intersection *)0x0) {
      pIVar3 = pIVar2;
    }
  }
  return pIVar3;
}

Assistant:

Intersection *CornellBox::intersects(Ray &r) {
    Intersection *i = NULL, *tmp;
    
    for(int t = 0; t < triangles.size(); ++t) {
    	tmp = triangles.at(t)->intersects(r);
        if( tmp ) {
            i = tmp;
        }
    }
    return i;
}